

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

void pybind11::detail::clear_instance(PyObject *self)

{
  instance *piVar1;
  PyTypeObject *pPVar2;
  long *plVar3;
  bool bVar4;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var5;
  internals *piVar6;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar7;
  byte bVar8;
  long lVar9;
  type_info *tinfo;
  long lVar10;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar12;
  PyTypeObject *local_68;
  PyObject *local_60;
  iterator __begin2;
  
  pPVar2 = self->ob_type;
  pVar11 = all_type_info_get_cache(pPVar2);
  _Var5 = pVar11.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (pPVar2,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)((long)_Var5.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                ._M_cur + 0x10));
  }
  __begin2.inst =
       (instance *)
       ((long)_Var5.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x10);
  if (*(undefined8 **)
       ((long)_Var5.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x10) ==
      *(undefined8 **)
       ((long)_Var5.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x18)) {
    tinfo = (type_info *)0x0;
  }
  else {
    tinfo = (type_info *)
            **(undefined8 **)
              ((long)_Var5.
                     super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                     ._M_cur + 0x10);
  }
  __begin2.curr.inst = (instance *)0x0;
  __begin2.curr.type = (type_info *)(self + 1);
  if ((self[3].ob_refcnt & 2) == 0) {
    __begin2.curr.type = (type_info *)(__begin2.curr.type)->type;
  }
  lVar10 = (long)*(undefined8 **)
                  ((long)_Var5.
                         super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         ._M_cur + 0x18) - ((__begin2.inst)->ob_base).ob_refcnt;
  local_60 = self;
  __begin2.types = (type_vec *)self;
  __begin2.curr.index = (size_t)tinfo;
  if (lVar10 != 0) {
    do {
      pPVar2 = (__begin2.curr.type)->type;
      if (pPVar2 != (PyTypeObject *)0x0) {
        bVar8 = *(byte *)&__begin2.types[2].
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        if ((bVar8 & 2) == 0) {
          bVar8 = *(byte *)((long)&((__begin2.curr.inst)->ob_base).ob_refcnt +
                           (long)__begin2.types[1].
                                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 2;
        }
        else {
          bVar8 = bVar8 >> 3 & 1;
        }
        __begin2.curr.index = (size_t)tinfo;
        if (bVar8 != 0) {
          local_68 = pPVar2;
          piVar6 = get_internals();
          pVar12 = std::
                   _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(&(piVar6->registered_instances)._M_h,&local_68);
          __it._M_cur = (__node_type *)
                        pVar12.first.
                        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                        ._M_cur;
          if ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
               )__it._M_cur !=
              pVar12.second.
              super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
             ) {
            do {
              if (self->ob_type == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
                std::
                _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                ::erase(&(piVar6->registered_instances)._M_h,(const_iterator)__it._M_cur);
                bVar4 = true;
                goto LAB_00110f79;
              }
              __it._M_cur = *__it._M_cur;
            } while ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      )__it._M_cur !=
                     pVar12.second.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                    );
          }
          bVar4 = false;
LAB_00110f79:
          if ((tinfo->field_0x90 & 2) == 0) {
            traverse_offset_bases(pPVar2,tinfo,(instance *)self,deregister_instance_impl);
          }
          if (!bVar4) {
            pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
          }
        }
        if ((self[3].ob_refcnt & 1) == 0) {
          bVar8 = *(byte *)&__begin2.types[2].
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
          if ((bVar8 & 2) == 0) {
            bVar8 = *(byte *)((long)&((__begin2.curr.inst)->ob_base).ob_refcnt +
                             (long)__begin2.types[1].
                                   super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          }
          else {
            bVar8 = bVar8 >> 2;
          }
          if ((bVar8 & 1) == 0) goto LAB_00110fd1;
        }
        (**(code **)(__begin2.curr.index + 0x38))(&__begin2.types);
      }
LAB_00110fd1:
      if ((local_60[3].ob_refcnt & 2) == 0) {
        lVar9 = ((__begin2.inst)->ob_base).ob_refcnt;
        __begin2.curr.type =
             (type_info *)
             (&(__begin2.curr.type)->cpptype +
             *(long *)(*(long *)(lVar9 + (long)__begin2.curr.inst * 8) + 0x20));
      }
      else {
        lVar9 = ((__begin2.inst)->ob_base).ob_refcnt;
      }
      piVar1 = (instance *)((long)&((__begin2.curr.inst)->ob_base).ob_refcnt + 1);
      if (piVar1 < (instance *)((long)((__begin2.inst)->ob_base).ob_type - lVar9 >> 3)) {
        tinfo = *(type_info **)(lVar9 + 8 + (long)__begin2.curr.inst * 8);
      }
      else {
        tinfo = (type_info *)0x0;
      }
      __begin2.curr.inst = piVar1;
      __begin2.curr.index = (size_t)tinfo;
    } while (piVar1 != (instance *)(lVar10 >> 3));
  }
  instance::deallocate_layout((instance *)self);
  if (self[2].ob_type != (PyTypeObject *)0x0) {
    PyObject_ClearWeakRefs(self);
  }
  puVar7 = (undefined8 *)_PyObject_GetDictPtr(self);
  if ((puVar7 != (undefined8 *)0x0) && (plVar3 = (long *)*puVar7, plVar3 != (long *)0x0)) {
    *puVar7 = 0;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      _Py_Dealloc();
    }
  }
  if ((self[3].ob_refcnt & 0x10) != 0) {
    clear_patients(self);
  }
  return;
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}